

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntUnionFind.cpp
# Opt level: O2

int __thiscall Lib::IntUnionFind::root(IntUnionFind *this,int c)

{
  int *piVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int elem;
  int *piVar5;
  
  if ((root(int)::path == '\0') && (iVar2 = __cxa_guard_acquire(&root(int)::path), iVar2 != 0)) {
    Stack<int>::Stack(&root::path,8);
    __cxa_atexit(Stack<int>::~Stack,&root::path,&__dso_handle);
    __cxa_guard_release(&root(int)::path);
  }
  piVar3 = this->_parents;
  iVar2 = -1;
  while( true ) {
    elem = iVar2;
    iVar2 = c;
    piVar1 = root::path._stack;
    piVar4 = root::path._cursor;
    if (piVar3[iVar2] == -1) break;
    c = piVar3[iVar2];
    if (elem != -1) {
      Stack<int>::push(&root::path,elem);
      piVar3 = this->_parents;
      c = piVar3[iVar2];
    }
  }
  while (piVar5 = piVar4 + -1, piVar4 != piVar1) {
    root::path._cursor = piVar5;
    piVar3[*piVar5] = iVar2;
    piVar4 = piVar5;
  }
  return iVar2;
}

Assistant:

int IntUnionFind::root(int c) const
{
  static Stack<int> path(8);
  ASS(path.isEmpty());
  int prev=-1;

  while(_parents[c]!=-1) {
    if(prev!=-1) {
      path.push(prev);
    }
    prev=c;
    c=_parents[c];
  }

  while(path.isNonEmpty()) {
    _parents[path.pop()]=c;
  }
  return c;
}